

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

void Js::AsmJSByteCodeGenerator::EmitEmptyByteCode
               (FuncInfo *funcInfo,ByteCodeGenerator *byteCodeGen,ParseNode *functionNode)

{
  FunctionBody *functionWrite;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ByteCodeWriter *this;
  undefined1 local_38 [8];
  AutoCleanup autoCleanup;
  
  ParseableFunctionInfo::SetGrfscr(funcInfo->byteCodeFunction,byteCodeGen->flags);
  ParseableFunctionInfo::SetSourceInfo
            (funcInfo->byteCodeFunction,byteCodeGen->sourceIndex,funcInfo->root,
             (bool)((byte)(byteCodeGen->flags >> 0xb) & 1),(byteCodeGen->flags & 0x820) == 0x20);
  functionWrite = (FunctionBody *)funcInfo->byteCodeFunction;
  bVar2 = FunctionProxy::IsFunctionBody((FunctionProxy *)functionWrite);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this = &byteCodeGen->m_writer;
  local_38 = (undefined1  [8])functionWrite;
  autoCleanup.mFunctionBody = (FunctionBody *)byteCodeGen;
  ByteCodeWriter::Begin(this,functionWrite,byteCodeGen->alloc,false,false,false);
  ByteCodeWriter::StartStatement(this,functionNode,0);
  ByteCodeWriter::Empty(this,Nop);
  ByteCodeWriter::EndStatement(this,functionNode);
  ByteCodeWriter::End(this);
  FunctionBody::CheckAndSetConstantCount(functionWrite,2);
  local_38 = (undefined1  [8])0x0;
  EmitEmptyByteCode::AutoCleanup::~AutoCleanup((AutoCleanup *)local_38);
  return;
}

Assistant:

void AsmJSByteCodeGenerator::EmitEmptyByteCode(FuncInfo * funcInfo, ByteCodeGenerator * byteCodeGen, ParseNode * functionNode)
    {
        funcInfo->byteCodeFunction->SetGrfscr(byteCodeGen->GetFlags());
        funcInfo->byteCodeFunction->SetSourceInfo(byteCodeGen->GetCurrentSourceIndex(),
            funcInfo->root,
            !!(byteCodeGen->GetFlags() & fscrEvalCode),
            ((byteCodeGen->GetFlags() & fscrDynamicCode) && !(byteCodeGen->GetFlags() & fscrEvalCode)));

        FunctionBody * functionBody = funcInfo->byteCodeFunction->GetFunctionBody();

        class AutoCleanup
        {
        private:
            FunctionBody * mFunctionBody;
            ByteCodeGenerator * mByteCodeGen;
        public:
            AutoCleanup(FunctionBody * functionBody, ByteCodeGenerator * byteCodeGen) : mFunctionBody(functionBody), mByteCodeGen(byteCodeGen)
            {
            }

            void Done()
            {
                mFunctionBody = nullptr;
            }
            ~AutoCleanup()
            {
                if (mFunctionBody)
                {
                    mFunctionBody->ResetByteCodeGenState();
                    mByteCodeGen->Writer()->Reset();
                }
            }
        } autoCleanup(functionBody, byteCodeGen);

        byteCodeGen->Writer()->Begin(functionBody, byteCodeGen->GetAllocator(), false, false, false);
        byteCodeGen->Writer()->StartStatement(functionNode, 0);
        byteCodeGen->Writer()->Empty(OpCode::Nop);
        byteCodeGen->Writer()->EndStatement(functionNode);
        byteCodeGen->Writer()->End();

        functionBody->CheckAndSetConstantCount(FuncInfo::InitialConstRegsCount);

        autoCleanup.Done();
    }